

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uttt.h
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
uttt::IBoardWriter::operator()
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,IBoardWriter *this,
          vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *boards)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pIVar3;
  pointer pcVar4;
  long lVar5;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *__range2;
  allocator_type local_11;
  
  std::vector<char,_std::allocator<char>_>::vector
            (__return_storage_ptr__,
             (long)(boards->super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(boards->super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>)._M_impl
                   .super__Vector_impl_data._M_start,&local_11);
  pIVar2 = (boards->super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar3 = (boards->super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (lVar5 = 0; pIVar1 = (pointer)((long)(pIVar2->micro)._M_elems + lVar5 + -4), pIVar1 != pIVar3;
      lVar5 = lVar5 + 0x18) {
    pcVar4 = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar4[lVar5] = *(char *)((long)&pIVar1->macro + 3);
    pcVar4[lVar5 + 1] = *(char *)((long)&pIVar1->macro + 2);
    pcVar4[lVar5 + 2] = *(char *)((long)&pIVar1->macro + 1);
    pcVar4[lVar5 + 3] = (char)pIVar1->macro;
    pcVar4[lVar5 + 4] = *(char *)((long)(pIVar1->micro)._M_elems + 1);
    pcVar4[lVar5 + 5] = (char)(pIVar1->micro)._M_elems[0];
    pcVar4[lVar5 + 6] = *(char *)((long)(pIVar1->micro)._M_elems + 3);
    pcVar4[lVar5 + 7] = (char)(pIVar1->micro)._M_elems[1];
    pcVar4[lVar5 + 8] = *(char *)((long)(pIVar1->micro)._M_elems + 5);
    pcVar4[lVar5 + 9] = (char)(pIVar1->micro)._M_elems[2];
    pcVar4[lVar5 + 10] = *(char *)((long)(pIVar1->micro)._M_elems + 7);
    pcVar4[lVar5 + 0xb] = (char)(pIVar1->micro)._M_elems[3];
    pcVar4[lVar5 + 0xc] = *(char *)((long)(pIVar1->micro)._M_elems + 9);
    pcVar4[lVar5 + 0xd] = (char)(pIVar1->micro)._M_elems[4];
    pcVar4[lVar5 + 0xe] = *(char *)((long)(pIVar1->micro)._M_elems + 0xb);
    pcVar4[lVar5 + 0xf] = (char)(pIVar1->micro)._M_elems[5];
    pcVar4[lVar5 + 0x10] = *(char *)((long)(pIVar1->micro)._M_elems + 0xd);
    pcVar4[lVar5 + 0x11] = (char)(pIVar1->micro)._M_elems[6];
    pcVar4[lVar5 + 0x12] = *(char *)((long)(pIVar1->micro)._M_elems + 0xf);
    pcVar4[lVar5 + 0x13] = (char)(pIVar1->micro)._M_elems[7];
    pcVar4[lVar5 + 0x14] = *(char *)((long)(pIVar1->micro)._M_elems + 0x11);
    pcVar4[lVar5 + 0x15] = (char)(pIVar1->micro)._M_elems[8];
    pcVar4[lVar5 + 0x16] = pIVar1->next;
    pcVar4[lVar5 + 0x17] = pIVar1->player;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> operator()(const std::vector<IBoard> &boards) const
    {
        std::vector<char> bytes(IBoardSize * boards.size());
        long long offset = 0;
        for (const auto &board : boards)
        {
            auto it = &bytes[offset];
            it[0] = uint32_t(board.macro) >> 24;
            it[1] = (uint32_t(board.macro) >> 16) & 0xff;
            it[2] = (uint32_t(board.macro) >> 8) & 0xff;
            it[3] = uint32_t(board.macro) & 0xff;
            it[4] = uint16_t(board.micro[0]) >> 8;
            it[5] = board.micro[0] & 0xff;
            it[6] = uint16_t(board.micro[1]) >> 8;
            it[7] = board.micro[1] & 0xff;
            it[8] = uint16_t(board.micro[2]) >> 8;
            it[9] = board.micro[2] & 0xff;
            it[10] = uint16_t(board.micro[3]) >> 8;
            it[11] = board.micro[3] & 0xff;
            it[12] = uint16_t(board.micro[4]) >> 8;
            it[13] = board.micro[4] & 0xff;
            it[14] = uint16_t(board.micro[5]) >> 8;
            it[15] = board.micro[5] & 0xff;
            it[16] = uint16_t(board.micro[6]) >> 8;
            it[17] = board.micro[6] & 0xff;
            it[18] = uint16_t(board.micro[7]) >> 8;
            it[19] = board.micro[7] & 0xff;
            it[20] = uint16_t(board.micro[8]) >> 8;
            it[21] = board.micro[8] & 0xff;
            it[22] = board.next;
            it[23] = board.player;
            offset += IBoardSize;
        }
        return bytes;
    }